

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O1

void unzip(char *fn)

{
  char cVar1;
  archive_entry *entry;
  short extraout_AX;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  int iVar5;
  archive *a;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  int *piVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  archive_entry *e;
  stat sb;
  archive_entry *local_118;
  char *local_110;
  char *local_108;
  uint local_fc;
  time_t local_f8;
  char *local_f0;
  timespec local_e8;
  time_t local_d8;
  long local_d0;
  stat local_c0;
  
  a = archive_read_new();
  if (a == (archive *)0x0) goto LAB_00104bb2;
  wVar2 = archive_read_support_format_zip(a);
  if ((wVar2 == L'\0') &&
     ((O_arg == (char *)0x0 ||
      (wVar2 = archive_read_set_format_option(a,"zip","hdrcharset",O_arg), wVar2 == L'\0')))) {
    if (P_arg == (char *)0x0) {
      archive_read_set_passphrase_callback(a,(void *)0x0,passphrase_callback);
    }
    else {
      archive_read_add_passphrase(a,P_arg);
    }
    wVar2 = archive_read_open_filename(a,fn,0x2000);
    if (wVar2 != L'\0') goto LAB_00104b99;
    if (zipinfo_mode == '\0') {
      if ((p_opt == '\0') && ((q_opt & 1) == 0)) {
        printf("Archive:  %s\n",fn);
      }
      if (v_opt == 1) {
        pcVar10 = " --------    %s----   ----    ----\n";
        pcVar13 = "  Length     %sDate   Time    Name\n";
      }
      else {
        if (v_opt != 2) goto LAB_001043b5;
        pcVar10 = "--------  ------  ------- -----   %s----   ----   ------    ----\n";
        pcVar13 = " Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n";
      }
      printf(pcVar13,y_str);
      printf(pcVar10,y_str);
    }
LAB_001043b5:
    pcVar10 = (char *)0x0;
    lVar14 = 0;
    lVar15 = 0;
    local_f0 = fn;
    while (iVar3 = archive_read_next_header(a,&local_118), entry = local_118, iVar3 == 0) {
      if (zipinfo_mode == '\0') {
        if (t_opt == '\x01') {
          mVar4 = archive_entry_filetype(local_118);
          if ((mVar4 & 0xf000) == 0x4000) {
            uVar16 = 0;
          }
          else {
            pcVar13 = archive_entry_pathname(entry);
            info("    testing: %s\t",pcVar13);
            do {
              lVar6 = archive_read_data(a,buffer,0x2000);
            } while (0 < lVar6);
            if (lVar6 < 0) {
              pcVar13 = archive_error_string(a);
              info(" %s\n",pcVar13);
            }
            else {
              info(" OK\n");
            }
            uVar16 = (ulong)(lVar6 < 0);
            iVar3 = archive_read_data_skip(a);
            if (iVar3 != 0) goto LAB_00104b99;
          }
          pcVar10 = pcVar10 + uVar16;
        }
        else {
          if (v_opt != 0) goto LAB_0010442b;
          local_110 = pcVar10;
          if ((p_opt != '\0') || ((c_opt & 1) != 0)) {
            pcVar10 = archive_entry_pathname(local_118);
            pcVar10 = pathdup(pcVar10);
            if (pcVar10 == (char *)0x0) {
              warningx("skipping empty or unreadable filename entry");
              iVar3 = archive_read_data_skip(a);
              pcVar10 = local_110;
              goto LAB_0010486f;
            }
            mVar4 = archive_entry_filetype(entry);
            uVar11 = mVar4 & 0xf000;
            if (uVar11 == 0x4000) {
LAB_00104890:
              iVar3 = archive_read_data_skip(a);
joined_r0x0010489f:
              if (iVar3 != 0) goto LAB_00104b99;
            }
            else {
              if ((uVar11 != 0x8000) && (uVar11 != 0xa000)) {
                warningx("skipping non-regular entry \'%s\'",pcVar10);
                goto LAB_00104890;
              }
              iVar3 = accept_pathname(pcVar10);
              if (iVar3 == 0) {
                iVar3 = archive_read_data_skip(a);
                goto joined_r0x0010489f;
              }
              if (c_opt == 1) {
                info("x %s\n",pcVar10);
              }
              extract2fd(a,pcVar10,1);
            }
            free(pcVar10);
            pcVar10 = local_110;
            goto LAB_00104652;
          }
          pcVar13 = archive_entry_pathname(local_118);
          pcVar13 = pathdup(pcVar13);
          if (pcVar13 == (char *)0x0) {
            warningx("skipping empty or unreadable filename entry");
            iVar3 = archive_read_data_skip(a);
LAB_0010486f:
            if (iVar3 == 0) goto LAB_00104652;
            goto LAB_00104b99;
          }
          local_108 = pcVar13;
          mVar4 = archive_entry_filetype(entry);
          if (((*local_108 == '/') || (iVar3 = strncmp(local_108,"../",3), iVar3 == 0)) ||
             (pcVar10 = strstr(local_108,"/../"), pcVar10 != (char *)0x0)) {
            pcVar10 = "skipping insecure entry \'%s\'";
LAB_00104683:
            warningx(pcVar10,local_108);
LAB_0010468d:
            iVar3 = archive_read_data_skip(a);
            if (iVar3 != 0) goto LAB_00104b99;
          }
          else {
            uVar11 = mVar4 & 0xf000;
            if (((uVar11 != 0x4000) && (uVar11 != 0x8000)) && (uVar11 != 0xa000)) {
              pcVar10 = "skipping non-regular entry \'%s\'";
              goto LAB_00104683;
            }
            if (((uVar11 == 0x4000) && ((j_opt & 1) != 0)) ||
               (iVar3 = accept_pathname(local_108), iVar3 == 0)) goto LAB_0010468d;
            pcVar10 = local_108;
            pcVar13 = local_108;
            pcVar12 = local_108;
            if (j_opt == 1) {
              do {
                do {
                  pcVar12 = pcVar13;
                  pcVar13 = pcVar10 + 1;
                  cVar1 = *pcVar10;
                  pcVar10 = pcVar13;
                } while (cVar1 == '/');
                pcVar13 = pcVar12;
              } while (cVar1 != '\0');
            }
            pcVar10 = pathcat(d_arg,pcVar12);
            make_parent(pcVar10);
            if (uVar11 == 0x4000) {
              if (*pcVar10 != '\0') {
                mVar4 = archive_entry_mode(entry);
                uVar11 = mVar4 & 0x1ff | 0x1c0;
                if ((mVar4 & 0x1ff) == 0) {
                  uVar11 = 0x1ed;
                }
                info("   creating: %s/\n",pcVar10);
                iVar3 = lstat(pcVar10,&local_c0);
                if (iVar3 == 0) {
                  if ((local_c0.st_mode & 0xf000) != 0x4000) {
                    unlink(pcVar10);
                    goto LAB_00104745;
                  }
                }
                else {
LAB_00104745:
                  iVar3 = mkdir(pcVar10,uVar11 >> 2 & 9 | uVar11);
                  if ((iVar3 != 0) && (piVar8 = __errno_location(), *piVar8 != 0x11)) {
                    pcVar13 = "mkdir(\'%s\')";
LAB_00104c04:
                    error(pcVar13,pcVar10);
                  }
                }
                iVar3 = archive_read_data_skip(a);
                if (iVar3 != 0) goto LAB_00104b99;
              }
            }
            else {
              mVar4 = archive_entry_mode(entry);
              local_fc = mVar4 & 0x1ff;
              if (local_fc == 0) {
                local_fc = 0x1a4;
              }
              local_f8 = archive_entry_mtime(entry);
              lVar9 = archive_entry_mtime_nsec(entry);
              do {
                iVar3 = lstat(pcVar10,&local_c0);
                if (iVar3 != 0) {
                  if (f_opt == 0) goto LAB_00104914;
                  goto LAB_0010477b;
                }
                if ((u_opt != '\0') || ((f_opt & 1) != 0)) {
                  if (((local_c0.st_mode & 0xf000) == 0x8000) &&
                     ((local_f8 < local_c0.st_mtim.tv_sec ||
                      ((local_c0.st_mtim.tv_sec == local_f8 && (lVar9 <= local_c0.st_mtim.tv_nsec)))
                      ))) goto LAB_0010477b;
LAB_0010490a:
                  unlink(pcVar10);
                  goto LAB_00104914;
                }
                if (o_opt != '\0') goto LAB_0010490a;
                if (n_opt != '\0') goto LAB_0010477b;
                unzip_cold_1();
              } while (extraout_AX == 1);
              if (extraout_AX == 0) {
LAB_00104914:
                local_e8.tv_sec = 0;
                local_e8.tv_nsec = 0x3fffffff;
                local_d8 = local_f8;
                local_d0 = lVar9;
                pcVar13 = archive_entry_symlink(entry);
                if (pcVar13 == (char *)0x0) {
                  iVar3 = open(pcVar10,0x242,(ulong)local_fc);
                  if (iVar3 < 0) {
                    pcVar13 = "open(\'%s\')";
                    goto LAB_00104c04;
                  }
                  info(" extracting: %s",pcVar10);
                  iVar5 = extract2fd(a,pcVar10,iVar3);
                  if (tty == '\x01') {
                    info("  \b\b");
                  }
                  if (iVar5 != 0) {
                    info(" (text)");
                  }
                  info("\n");
                  iVar5 = futimens(iVar3,&local_e8);
                  if (iVar5 != 0) {
                    pcVar13 = "futimens(\'%s\')";
                    goto LAB_00104c04;
                  }
                  iVar3 = close(iVar3);
                  if (iVar3 != 0) {
                    pcVar13 = "close(\'%s\')";
                    goto LAB_00104c04;
                  }
                }
                else {
                  iVar3 = symlink(pcVar13,pcVar10);
                  if (iVar3 != 0) {
                    pcVar13 = "symlink(\'%s\')";
                    goto LAB_00104c04;
                  }
                  info(" extracting: %s -> %s\n",pcVar10,pcVar13);
                  iVar3 = lchmod(pcVar10,local_fc);
                  if (iVar3 != 0) {
                    warning("Cannot set mode for \'%s\'",pcVar10);
                  }
                  iVar3 = utimensat(-100,pcVar10,&local_e8,0x100);
                  if (iVar3 != 0) {
                    warning("utimensat(\'%s\')",pcVar10);
                  }
                }
              }
            }
LAB_0010477b:
            free(pcVar10);
          }
          free(local_108);
          pcVar10 = local_110;
        }
      }
      else if (Z1_opt == '\x01') {
LAB_0010442b:
        list(a,local_118);
      }
LAB_00104652:
      lVar7 = archive_entry_size(local_118);
      lVar15 = lVar15 + lVar7;
      lVar14 = lVar14 + 1;
    }
    if (iVar3 != 1) goto LAB_00104b99;
    if (zipinfo_mode == '\x01') {
      if (v_opt == 2) {
        printf("--------          -------  ---                            %s-------\n",y_str);
        pcVar13 = "s";
        if (lVar14 == 1) {
          pcVar13 = "";
        }
        printf("%8ju          %7ju   0%%                            %s%ju file%s\n",lVar15,lVar15,
               y_str,lVar14,pcVar13);
      }
      else if (v_opt == 1) {
        printf(" --------                   %s-------\n",y_str);
        pcVar13 = "s";
        if (lVar14 == 1) {
          pcVar13 = "";
        }
        printf(" %8ju                   %s%ju file%s\n",lVar15,y_str,lVar14,pcVar13);
      }
    }
    iVar3 = archive_read_free(a);
    pcVar12 = local_f0;
    pcVar13 = passphrase_buf;
    if (iVar3 != 0) goto LAB_00104b99;
    if (passphrase_buf != (char *)0x0) {
      memset(passphrase_buf,0,0x400);
      free(pcVar13);
    }
    if (t_opt != '\x01') {
      return;
    }
    if (pcVar10 == (char *)0x0) {
      printf("No errors detected in compressed data of %s.\n",pcVar12);
      return;
    }
    pcVar13 = "%ju checksum error(s) found.";
  }
  else {
LAB_00104b99:
    pcVar10 = archive_error_string(a);
    pcVar13 = "%s";
  }
  errorx(pcVar13,pcVar10);
LAB_00104bb2:
  error("archive_read_new failed");
}

Assistant:

static void
unzip(const char *fn)
{
	struct archive *a;
	struct archive_entry *e;
	int ret;
	uintmax_t total_size, file_count, error_count;

	if ((a = archive_read_new()) == NULL)
		error("archive_read_new failed");

	ac(archive_read_support_format_zip(a));

	if (O_arg)
		ac(archive_read_set_format_option(a, "zip", "hdrcharset", O_arg));

	if (P_arg)
		archive_read_add_passphrase(a, P_arg);
	else
		archive_read_set_passphrase_callback(a, NULL,
			&passphrase_callback);

	ac(archive_read_open_filename(a, fn, 8192));

	if (!zipinfo_mode) {
		if (!p_opt && !q_opt)
			printf("Archive:  %s\n", fn);
		if (v_opt == 1) {
			printf("  Length     %sDate   Time    Name\n", y_str);
			printf(" --------    %s----   ----    ----\n", y_str);
		} else if (v_opt == 2) {
			printf(" Length   Method    Size  Ratio   %sDate   Time   CRC-32    Name\n", y_str);
			printf("--------  ------  ------- -----   %s----   ----   ------    ----\n", y_str);
		}
	}

	total_size = 0;
	file_count = 0;
	error_count = 0;
	for (;;) {
		ret = archive_read_next_header(a, &e);
		if (ret == ARCHIVE_EOF)
			break;
		ac(ret);
		if (!zipinfo_mode) {
			if (t_opt)
				error_count += test(a, e);
			else if (v_opt)
				list(a, e);
			else if (p_opt || c_opt)
				extract_stdout(a, e);
			else
				extract(a, e);
		} else {
			if (Z1_opt)
				list(a, e);
		}

		total_size += archive_entry_size(e);
		++file_count;
	}

	if (zipinfo_mode) {
		if (v_opt == 1) {
			printf(" --------                   %s-------\n", y_str);
			printf(" %8ju                   %s%ju file%s\n",
			    total_size, y_str, file_count, file_count != 1 ? "s" : "");
		} else if (v_opt == 2) {
			printf("--------          -------  ---                            %s-------\n", y_str);
			printf("%8ju          %7ju   0%%                            %s%ju file%s\n",
			    total_size, total_size, y_str, file_count,
			    file_count != 1 ? "s" : "");
		}
	}

	ac(archive_read_free(a));

	if (passphrase_buf != NULL) {
		memset(passphrase_buf, 0, PPBUFF_SIZE);
		free(passphrase_buf);
	}

	if (t_opt) {
		if (error_count > 0) {
			errorx("%ju checksum error(s) found.", error_count);
		}
		else {
			printf("No errors detected in compressed data of %s.\n",
			       fn);
		}
	}
}